

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTypeOptimization.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_226::FieldInfoScanner::~FieldInfoScanner(FieldInfoScanner *this)

{
  FieldInfoScanner *this_local;
  
  StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>::
  ~StructScanner((StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner> *)
                 this);
  return;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<FieldInfoScanner>(functionNewInfos,
                                              functionSetGetInfos);
  }